

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O0

NodeAVL * avlRemoveThisNode(NodeAVL *nd,int freeMem)

{
  long lVar1;
  NodeAVL *p_00;
  NodeAVL *pNVar2;
  int in_ESI;
  void *in_RDI;
  NodeAVL *min;
  NodeAVL *p;
  NodeAVL *r;
  NodeAVL *l;
  NodeAVL *nd_00;
  NodeAVL *local_8;
  
  local_8 = *(NodeAVL **)((long)in_RDI + 0x20);
  lVar1 = *(long *)((long)in_RDI + 0x28);
  nd_00 = *(NodeAVL **)((long)in_RDI + 0x30);
  if (in_ESI != 0) {
    free(in_RDI);
  }
  if (lVar1 == 0) {
    if (local_8 != (NodeAVL *)0x0) {
      local_8->parent = nd_00;
    }
  }
  else {
    p_00 = avlFindMin(nd_00);
    if (p_00->right != (NodeAVL *)0x0) {
      p_00->right->parent = p_00->parent;
    }
    pNVar2 = avlRemoveMin(p_00);
    p_00->right = pNVar2;
    p_00->left = local_8;
    p_00->parent = nd_00;
    if (p_00->left != (NodeAVL *)0x0) {
      p_00->left->parent = p_00;
    }
    if (p_00->right != (NodeAVL *)0x0) {
      p_00->right->parent = p_00;
    }
    local_8 = avlBalance(p_00);
  }
  return local_8;
}

Assistant:

static
NodeAVL* avlRemoveThisNode( NodeAVL* nd, const int freeMem ){

    #ifdef DEBUG_AVL
      printf( "avlRemoveThisNode id=%d\n", nd->id );
      printf( "=============== ND tree from avlRemoveThisNode  ===============\n" );
      printTree( "", nd );
      printf( "===============================================================\n" );
    #endif

    NodeAVL* l = nd->left;
    NodeAVL* r = nd->right;
    NodeAVL* p = nd->parent;
    if ( freeMem ){ free( nd ); nd = 0; }
    if( !r ){ if ( l ) l->parent = p; return l; }
    NodeAVL* min = avlFindMin(r);

    #ifdef DEBUG_AVL
      if ( min ){
          printf( "*** r->id=%d min->id=%d min->parent->id=%d\n", r->id, min->id, min->parent->id );
          if ( min->left ) printf( "min->left->id=%d\n", min->left->id );
          if ( min->right ) printf( "min->right->id=%d\n", min->right->id );
      }
    #endif

    if ( min->right ) min->right->parent = min->parent;

    min->right = avlRemoveMin(r);
    min->left = l;

    #ifdef DEBUG_AVL
      if ( min->right ){
          printf( "=========  MIN->RIGHT tree from avlRemoveThisNode  ============\n" );
          printf( "min->right=%d\n", min->right->id );
          printTree( "", min->right );
          printf( "===============================================================\n" );
      }
    #endif

    min->parent = p;
    if ( min->left ) min->left->parent = min;
    if ( min->right ) min->right->parent = min;

    #ifdef DEBUG_AVL
      printf( "============== MIN tree from avlRemoveThisNode  ===============\n" );
      printTree( "", min );
      printf( "===============================================================\n" );
    #endif

    return avlBalance(min);
}